

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int ReadInt32(unqlite_file *pFd,sxu32 *pOut,sxi64 iOfft)

{
  int iVar1;
  uchar zBuf [4];
  uint local_c;
  
  iVar1 = (*pFd->pMethods->xRead)(pFd,&local_c,4,iOfft);
  if (iVar1 == 0) {
    *pOut = local_c >> 0x18 | (local_c & 0xff0000) >> 8 | (local_c & 0xff00) << 8 | local_c << 0x18;
  }
  return iVar1;
}

Assistant:

static int ReadInt32(unqlite_file *pFd,sxu32 *pOut,sxi64 iOfft)
{
	unsigned char zBuf[4];
	int rc;
	rc = unqliteOsRead(pFd,zBuf,sizeof(zBuf),iOfft);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	SyBigEndianUnpack32(zBuf,pOut);
	return UNQLITE_OK;
}